

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O0

int nni_epoll_pq_add_eventfd(nni_posix_pollq *pq)

{
  int __fd;
  int iVar1;
  int *piVar2;
  undefined1 local_24 [4];
  int fd;
  epoll_event ev;
  nni_posix_pollq *pq_local;
  
  ev.data = (epoll_data_t)pq;
  memset(local_24,0,0xc);
  __fd = eventfd(0,0x800);
  if (__fd < 0) {
    piVar2 = __errno_location();
    pq_local._4_4_ = nni_plat_errno(*piVar2);
  }
  else {
    fcntl(__fd,2,1);
    fcntl(__fd,4,0x800);
    local_24 = (undefined1  [4])0x1;
    _fd = 0;
    iVar1 = epoll_ctl(*(int *)(ev.data.u64 + 0x60),1,__fd,(epoll_event *)local_24);
    if (iVar1 == 0) {
      *(int *)(ev.data.u64 + 100) = __fd;
      pq_local._4_4_ = 0;
    }
    else {
      close(__fd);
      piVar2 = __errno_location();
      pq_local._4_4_ = nni_plat_errno(*piVar2);
    }
  }
  return pq_local._4_4_;
}

Assistant:

static int
nni_epoll_pq_add_eventfd(nni_posix_pollq *pq)
{
	// add event fd so we can wake ourself on exit
	struct epoll_event ev;
	int                fd;

	memset(&ev, 0, sizeof(ev));

	if ((fd = eventfd(0, EFD_NONBLOCK)) < 0) {
		return (nni_plat_errno(errno));
	}
	(void) fcntl(fd, F_SETFD, FD_CLOEXEC);
	(void) fcntl(fd, F_SETFL, O_NONBLOCK);

	// This is *NOT* one shot.  We want to wake EVERY single time.
	ev.events   = EPOLLIN;
	ev.data.ptr = 0;

	if (epoll_ctl(pq->epfd, EPOLL_CTL_ADD, fd, &ev) != 0) {
		(void) close(fd);
		return (nni_plat_errno(errno));
	}
	pq->evfd = fd;
	return (0);
}